

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  uint uVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Real a;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Item *this_02;
  int iVar9;
  int *piVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  undefined7 in_register_00000081;
  Item *this_03;
  bool bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_140;
  uint local_13c;
  cpp_dec_float<50U,_int,_void> local_138;
  undefined4 local_f4;
  Item *local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  if ((j | i) < 0) {
    return;
  }
  local_f4 = (undefined4)CONCAT71(in_register_00000081,scale);
  this_03 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_f0 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[j].idx;
  local_88._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_a8 = *(uint (*) [2])(val->m_backend).data._M_elems;
  auStack_a0 = *(uint (*) [2])((val->m_backend).data._M_elems + 2);
  local_98 = *(uint (*) [2])((val->m_backend).data._M_elems + 4);
  auStack_90 = *(uint (*) [2])((val->m_backend).data._M_elems + 6);
  iVar9 = (val->m_backend).exp;
  bVar15 = (val->m_backend).neg;
  local_78._0_4_ = (val->m_backend).fpclass;
  local_78._4_4_ = (val->m_backend).prec_elem;
  uStack_70 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_140 = i;
  local_13c = j;
  a = Tolerances::epsilon(this_00);
  local_e8.data._M_elems[8] = local_88[0];
  local_e8.data._M_elems[9] = local_88[1];
  local_e8.data._M_elems[4] = local_98[0];
  local_e8.data._M_elems[5] = local_98[1];
  local_e8.data._M_elems[6] = auStack_90[0];
  local_e8.data._M_elems[7] = auStack_90[1];
  local_e8.data._M_elems[0] = local_a8[0];
  local_e8.data._M_elems[1] = local_a8[1];
  uVar3 = local_e8.data._M_elems._0_8_;
  local_e8.data._M_elems[2] = auStack_a0[0];
  local_e8.data._M_elems[3] = auStack_a0[1];
  local_e8.exp = iVar9;
  local_e8.neg = bVar15;
  local_e8.fpclass = (fpclass_type)local_78;
  local_e8.prec_elem = local_78._4_4_;
  if ((bVar15 != false) &&
     (local_e8.data._M_elems[0] = local_a8[0],
     local_e8.data._M_elems[0] != 0 || (fpclass_type)local_78 != cpp_dec_float_finite)) {
    local_e8.neg = (bool)(bVar15 ^ 1);
  }
  bVar15 = false;
  local_e8.data._M_elems._0_8_ = uVar3;
  if (((fpclass_type)local_78 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems._24_5_ = 0;
    local_138.data._M_elems[7]._1_3_ = 0;
    local_138.data._M_elems._32_5_ = 0;
    local_138.data._M_elems[9]._1_3_ = 0;
    local_138.exp = 0;
    local_138.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_138,a);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_e8,&local_138);
    bVar15 = 0 < iVar9;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  this_02 = local_f0;
  if (!bVar15) {
    pNVar4 = (this_03->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (uVar13 = (ulong)(this_03->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar13 < 1)) {
LAB_0024b231:
      iVar9 = -1;
    }
    else {
      if (pNVar4->idx == local_13c) {
        bVar15 = true;
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        piVar10 = &pNVar4[1].idx;
        do {
          if (uVar13 - 1 == uVar11) goto LAB_0024b231;
          uVar11 = uVar11 + 1;
          uVar2 = *piVar10;
          piVar10 = piVar10 + 0xf;
        } while (uVar2 != local_13c);
        bVar15 = uVar11 < uVar13;
      }
      iVar9 = (int)uVar11;
      if (!bVar15) goto LAB_0024b231;
    }
    if (iVar9 < 0) {
      return;
    }
    pNVar5 = (local_f0->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar5 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (uVar13 = (ulong)(local_f0->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar13 < 1)) {
LAB_0024b33b:
      iVar9 = -1;
    }
    else {
      if (pNVar5->idx == local_140) {
        bVar15 = true;
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        piVar10 = &pNVar5[1].idx;
        do {
          if (uVar13 - 1 == uVar11) goto LAB_0024b33b;
          uVar11 = uVar11 + 1;
          uVar2 = *piVar10;
          piVar10 = piVar10 + 0xf;
        } while (uVar2 != local_140);
        bVar15 = uVar11 < uVar13;
      }
      iVar9 = (int)uVar11;
      if (!bVar15) goto LAB_0024b33b;
    }
    if (iVar9 < 0) {
      return;
    }
    if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (pcVar12 = (char *)(long)(this_03->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, (long)pcVar12 < 1)) {
LAB_0024b42f:
      pcVar14 = (char *)0xffffffff;
    }
    else {
      if (pNVar4->idx == local_13c) {
        bVar15 = true;
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = (char *)0x0;
        piVar10 = &pNVar4[1].idx;
        do {
          if (pcVar12 + -1 == pcVar14) goto LAB_0024b42f;
          pcVar14 = pcVar14 + 1;
          uVar2 = *piVar10;
          piVar10 = piVar10 + 0xf;
        } while (uVar2 != local_13c);
        bVar15 = pcVar14 < pcVar12;
      }
      if (!bVar15) goto LAB_0024b42f;
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_03,pcVar14);
    pNVar4 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (pcVar12 = (char *)(long)(this_02->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, 0 < (long)pcVar12)) {
      if (pNVar4->idx == local_140) {
        bVar15 = true;
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = (char *)0x0;
        piVar10 = &pNVar4[1].idx;
        do {
          if (pcVar12 + -1 == pcVar14) goto LAB_0024b501;
          pcVar14 = pcVar14 + 1;
          uVar2 = *piVar10;
          piVar10 = piVar10 + 0xf;
        } while (uVar2 != local_140);
        bVar15 = pcVar14 < pcVar12;
      }
      if (bVar15) goto LAB_0024b506;
    }
LAB_0024b501:
    pcVar14 = (char *)0xffffffff;
LAB_0024b506:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,pcVar14);
    return;
  }
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 10;
  local_138.data._M_elems._0_16_ = ZEXT816(0);
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems._24_5_ = 0;
  local_138.data._M_elems[7]._1_3_ = 0;
  local_138.data._M_elems._32_5_ = 0;
  local_138.data._M_elems[9]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  if ((char)local_f4 != '\0') {
    local_68 = (val->m_backend).data._M_elems[0];
    uStack_64 = (val->m_backend).data._M_elems[1];
    uStack_60 = (val->m_backend).data._M_elems[2];
    uStack_5c = (val->m_backend).data._M_elems[3];
    local_58 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uStack_50 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_48 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_40 = (val->m_backend).exp;
    local_3c = (val->m_backend).neg;
    local_38._0_4_ = (val->m_backend).fpclass;
    local_38._4_4_ = (val->m_backend).prec_elem;
    val = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_e8;
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])
              (val,this->lp_scaler,this,(ulong)local_140,(ulong)local_13c);
  }
  uVar3 = *(undefined8 *)
           ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 8);
  local_138.data._M_elems._32_5_ = SUB85(uVar3,0);
  local_138.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  uVar6 = *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems;
  uVar7 = *(undefined8 *)
           ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 2);
  local_138.data._M_elems._0_16_ =
       *(undefined1 (*) [16])
        (((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems;
  local_138.data._M_elems._16_8_ =
       *(undefined8 *)
        ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 4);
  uVar8 = *(undefined8 *)
           ((((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 6);
  local_138.data._M_elems._24_5_ = SUB85(uVar8,0);
  local_138.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
  local_138.exp = ((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->exp;
  local_138.neg = ((cpp_dec_float<50U,_int,_void> *)&(val->m_backend).data)->neg;
  local_138.fpclass = (val->m_backend).fpclass;
  local_138.prec_elem = (val->m_backend).prec_elem;
  pNVar4 = (this_03->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar13 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar13 < 1)) {
LAB_0024b1cc:
    iVar9 = -1;
  }
  else {
    if (pNVar4->idx == local_13c) {
      bVar15 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      piVar10 = &pNVar4[1].idx;
      do {
        if (uVar13 - 1 == uVar11) goto LAB_0024b1cc;
        uVar11 = uVar11 + 1;
        uVar2 = *piVar10;
        piVar10 = piVar10 + 0xf;
      } while (uVar2 != local_13c);
      bVar15 = uVar11 < uVar13;
    }
    iVar9 = (int)uVar11;
    if (!bVar15) goto LAB_0024b1cc;
  }
  if (iVar9 < 0) goto LAB_0024b2cb;
  pNVar5 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar5 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar13 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar13 < 1)) {
LAB_0024b29a:
    iVar9 = -1;
  }
  else {
    if (pNVar5->idx == local_140) {
      bVar15 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      piVar10 = &pNVar5[1].idx;
      do {
        if (uVar13 - 1 == uVar11) goto LAB_0024b29a;
        uVar11 = uVar11 + 1;
        uVar2 = *piVar10;
        piVar10 = piVar10 + 0xf;
      } while (uVar2 != local_140);
      bVar15 = uVar11 < uVar13;
    }
    iVar9 = (int)uVar11;
    if (!bVar15) goto LAB_0024b29a;
  }
  if (iVar9 < 0) {
LAB_0024b2cb:
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_140,1,(int *)&local_13c,
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_138);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_13c,1,(int *)&local_140,
           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_138);
    return;
  }
  if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar13 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar13 < 1)) {
LAB_0024b398:
    iVar9 = -1;
  }
  else {
    if (pNVar4->idx == local_13c) {
      bVar15 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      piVar10 = &pNVar4[1].idx;
      do {
        if (uVar13 - 1 == uVar11) goto LAB_0024b398;
        uVar11 = uVar11 + 1;
        uVar2 = *piVar10;
        piVar10 = piVar10 + 0xf;
      } while (uVar2 != local_13c);
      bVar15 = uVar11 < uVar13;
    }
    iVar9 = (int)uVar11;
    if (!bVar15) goto LAB_0024b398;
  }
  *(undefined8 *)(pNVar4[iVar9].val.m_backend.data._M_elems + 8) = uVar3;
  puVar1 = pNVar4[iVar9].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_138.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  *(undefined8 *)pNVar4[iVar9].val.m_backend.data._M_elems = uVar6;
  *(undefined8 *)(pNVar4[iVar9].val.m_backend.data._M_elems + 2) = uVar7;
  pNVar4[iVar9].val.m_backend.exp = local_138.exp;
  pNVar4[iVar9].val.m_backend.neg = local_138.neg;
  pNVar4[iVar9].val.m_backend.fpclass = local_138.fpclass;
  pNVar4[iVar9].val.m_backend.prec_elem = local_138.prec_elem;
  pNVar4 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar4 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (uVar13 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, 0 < (long)uVar13)) {
    if (pNVar4->idx == local_140) {
      bVar15 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      piVar10 = &pNVar4[1].idx;
      do {
        if (uVar13 - 1 == uVar11) goto LAB_0024b48f;
        uVar11 = uVar11 + 1;
        uVar2 = *piVar10;
        piVar10 = piVar10 + 0xf;
      } while (uVar2 != local_140);
      bVar15 = uVar11 < uVar13;
    }
    iVar9 = (int)uVar11;
    if (bVar15) goto LAB_0024b496;
  }
LAB_0024b48f:
  iVar9 = -1;
LAB_0024b496:
  *(undefined8 *)(pNVar4[iVar9].val.m_backend.data._M_elems + 8) = uVar3;
  puVar1 = pNVar4[iVar9].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_138.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  *(undefined8 *)pNVar4[iVar9].val.m_backend.data._M_elems = uVar6;
  *(undefined8 *)(pNVar4[iVar9].val.m_backend.data._M_elems + 2) = uVar7;
  pNVar4[iVar9].val.m_backend.exp = local_138.exp;
  pNVar4[iVar9].val.m_backend.neg = local_138.neg;
  pNVar4[iVar9].val.m_backend.fpclass = local_138.fpclass;
  pNVar4[iVar9].val.m_backend.prec_elem = local_138.prec_elem;
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }